

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchSet.cpp
# Opt level: O2

void Hpipe::anon_unknown_5::get_mean_depth_rec(double *sum,double *wgt,Node *node,double depth)

{
  Node *pNVar1;
  
  pNVar1 = (node->ok).data;
  if (pNVar1 != (Node *)0x0) {
    get_mean_depth_rec(sum,wgt,pNVar1,depth + 1.0);
  }
  pNVar1 = (node->ko).data;
  if (pNVar1 != (Node *)0x0) {
    get_mean_depth_rec(sum,wgt,pNVar1,depth + 1.0);
  }
  if (((node->ok).data == (Node *)0x0) && ((node->ko).data == (Node *)0x0)) {
    *sum = depth * node->freq + *sum;
    *wgt = node->freq + *wgt;
  }
  return;
}

Assistant:

static void get_mean_depth_rec( double &sum, double &wgt, const BranchSet::Node *node, double depth ) {
    if ( node->ok )
        get_mean_depth_rec( sum, wgt, node->ok.ptr(), depth + 1 );
    if ( node->ko )
        get_mean_depth_rec( sum, wgt, node->ko.ptr(), depth + 1 );
    if ( ! node->ok && ! node->ko ) {
        sum += node->freq * depth;
        wgt += node->freq;
    }
}